

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O2

void uv__fs_work(uv__work *w)

{
  uv_loop_s **buf;
  int iVar1;
  uv__work *ptr;
  iovec *piVar2;
  _func_void_uv__work_ptr_int *p_Var3;
  bool bVar4;
  undefined1 auVar5 [16];
  int iVar6;
  int iVar7;
  uv_dirent_type_t uVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  uint *puVar12;
  ssize_t sVar13;
  ulong uVar14;
  size_t sVar15;
  dirent64 *dent;
  char *pcVar16;
  _func_void_uv__work_ptr *p_Var17;
  DIR *pDVar18;
  size_t sVar19;
  ssize_t sVar20;
  _func_void_uv__work_ptr *p_Var21;
  uint uVar22;
  long lVar23;
  iovec *iov;
  code *pcVar24;
  _func_void_uv__work_ptr_int *p_Var25;
  _func_void_uv__work_ptr_int *p_Var26;
  long lVar27;
  size_t sVar28;
  _func_void_uv__work_ptr_int *p_StackY_2230;
  uint local_221c;
  _func_void_uv__work_ptr_int *local_2210;
  int local_21f8;
  uint minor;
  _func_void_uv__work_ptr_int *local_21f0;
  uv__work *local_21e8;
  long local_21e0;
  char *local_21d8;
  pollfd pfd;
  __ino_t local_21c8;
  __mode_t local_21b8;
  size_t local_21a0;
  stat dst_statsbuf;
  uint major;
  utsname u;
  
  iVar1 = *(int *)&w[-7].done;
  puVar12 = (uint *)__errno_location();
  local_21e8 = w + 1;
  buf = &w[-6].loop;
  do {
    *puVar12 = 0;
    switch(*(undefined4 *)&w[-7].done) {
    case 1:
      iVar7 = open64((char *)w[-6].done,*(uint *)((long)w[-2].wq + 4) | 0x80000,
                     (ulong)*(uint *)(w[-2].wq + 1));
      break;
    case 2:
      iVar7 = uv__close_nocancel(*(int *)w[-2].wq);
      if (iVar7 == -1) {
        iVar7 = -(uint)(*puVar12 != 0x73 && *puVar12 != 4);
      }
      break;
    case 3:
      uVar10 = uv__getiovmax();
      uVar9 = *(uint *)((long)w[-2].wq + 0xc);
      if (uVar10 < uVar9) {
        *(uint *)((long)w[-2].wq + 0xc) = uVar10;
        uVar9 = uVar10;
      }
      p_Var26 = w[-1].done;
      if ((long)p_Var26 < 0) {
        piVar2 = (iovec *)w[-1].work;
        if (uVar9 == 1) {
          p_StackY_2230 =
               (_func_void_uv__work_ptr_int *)
               read(*(int *)w[-2].wq,piVar2->iov_base,piVar2->iov_len);
        }
        else {
          p_StackY_2230 = (_func_void_uv__work_ptr_int *)readv(*(int *)w[-2].wq,piVar2,uVar9);
        }
      }
      else if (uVar9 == 1) {
        p_StackY_2230 =
             (_func_void_uv__work_ptr_int *)
             pread64(*(int *)w[-2].wq,*(void **)w[-1].work,*(size_t *)(w[-1].work + 8),
                     (__off64_t)p_Var26);
      }
      else if (uv__fs_read_no_preadv == '\x01') {
LAB_0017b40e:
        if (uVar9 == 0) {
          __assert_fail("nbufs > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/src/unix/fs.c"
                        ,0x1a4,"ssize_t uv__fs_preadv(uv_file, uv_buf_t *, unsigned int, off_t)");
        }
        iVar7 = *(int *)w[-2].wq;
        p_Var17 = w[-1].work;
        p_Var21 = p_Var17 + (ulong)uVar9 * 0x10;
        p_StackY_2230 = (_func_void_uv__work_ptr_int *)0x0;
        do {
          uVar14 = 0;
          do {
            while (sVar13 = pread64(iVar7,(void *)(*(long *)p_Var17 + uVar14),
                                    *(long *)(p_Var17 + 8) - uVar14,
                                    (__off64_t)(p_Var26 + (long)p_StackY_2230)), sVar13 == -1) {
              if ((long)(int)*puVar12 != 4) {
                if (p_StackY_2230 == (_func_void_uv__work_ptr_int *)0x0) {
                  p_StackY_2230 = (_func_void_uv__work_ptr_int *)-(long)(int)*puVar12;
                }
                goto LAB_0017b5e4;
              }
            }
            if (sVar13 == 0) goto LAB_0017b5e4;
            uVar14 = uVar14 + sVar13;
            p_StackY_2230 = p_StackY_2230 + sVar13;
          } while (uVar14 < *(ulong *)(p_Var17 + 8));
          p_Var17 = p_Var17 + 0x10;
        } while (p_Var17 != p_Var21);
      }
      else {
        p_StackY_2230 =
             (_func_void_uv__work_ptr_int *)
             uv__preadv(*(int *)w[-2].wq,(iovec *)w[-1].work,uVar9,(int64_t)p_Var26);
        if (p_StackY_2230 == (_func_void_uv__work_ptr_int *)0xffffffffffffffff) {
          if (*puVar12 == 0x26) {
            uv__fs_read_no_preadv = '\x01';
            uVar9 = *(uint *)((long)w[-2].wq + 0xc);
            p_Var26 = w[-1].done;
            goto LAB_0017b40e;
          }
          p_StackY_2230 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff;
        }
      }
LAB_0017b5e4:
      if ((uv__work *)w[-1].work != local_21e8) {
        uv__free((uv__work *)w[-1].work);
      }
      w[-1].work = (_func_void_uv__work_ptr *)0x0;
      *(undefined4 *)((long)w[-2].wq + 0xc) = 0;
      p_Var26 = p_StackY_2230;
      goto LAB_0017b2e5;
    case 4:
      uVar10 = uv__getiovmax();
      uVar9 = *(uint *)((long)w[-2].wq + 0xc);
      ptr = (uv__work *)w[-1].work;
      p_Var26 = (_func_void_uv__work_ptr_int *)0x0;
LAB_0017ad67:
      if (uVar9 != 0) {
        uVar22 = uVar10;
        if (uVar9 < uVar10) {
          uVar22 = uVar9;
        }
        *(uint *)((long)w[-2].wq + 0xc) = uVar22;
        do {
          p_Var25 = w[-1].done;
          if ((long)p_Var25 < 0) {
            piVar2 = (iovec *)w[-1].work;
            if (uVar22 == 1) {
              p_StackY_2230 =
                   (_func_void_uv__work_ptr_int *)
                   write(*(int *)w[-2].wq,piVar2->iov_base,piVar2->iov_len);
            }
            else {
              p_StackY_2230 = (_func_void_uv__work_ptr_int *)writev(*(int *)w[-2].wq,piVar2,uVar22);
            }
LAB_0017adde:
            if (-1 < (long)p_StackY_2230) goto LAB_0017ae1a;
            uVar22 = *puVar12;
          }
          else {
            iov = (iovec *)w[-1].work;
            if ((uVar22 == 1) || (uv__fs_write_no_pwritev == '\x01')) {
LAB_0017ad98:
              p_StackY_2230 =
                   (_func_void_uv__work_ptr_int *)
                   pwrite64(*(int *)w[-2].wq,iov->iov_base,iov->iov_len,(__off64_t)p_Var25);
              goto LAB_0017adde;
            }
            p_StackY_2230 =
                 (_func_void_uv__work_ptr_int *)
                 uv__pwritev(*(int *)w[-2].wq,iov,uVar22,(int64_t)p_Var25);
            if (p_StackY_2230 != (_func_void_uv__work_ptr_int *)0xffffffffffffffff)
            goto LAB_0017adde;
            uVar22 = *puVar12;
            if (uVar22 == 0x26) {
              uv__fs_write_no_pwritev = '\x01';
              iov = (iovec *)w[-1].work;
              p_Var25 = w[-1].done;
              goto LAB_0017ad98;
            }
            p_StackY_2230 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff;
          }
          if (uVar22 != 4) goto LAB_0017b7e0;
          uVar22 = *(uint *)((long)w[-2].wq + 0xc);
        } while( true );
      }
LAB_0017b7e7:
      if (ptr != local_21e8) {
        uv__free(ptr);
      }
      w[-1].work = (_func_void_uv__work_ptr *)0x0;
      *(undefined4 *)((long)w[-2].wq + 0xc) = 0;
      goto LAB_0017b2e5;
    case 5:
      iVar7 = *(int *)w[-2].wq;
      iVar11 = *(int *)((long)w[-2].wq + 4);
      dst_statsbuf.st_dev = (__dev_t)w[-1].done;
      if (uv__fs_sendfile_no_copy_file_range_support == '\0') {
        sVar20 = uv__fs_copy_file_range
                           (iVar11,(off_t *)&dst_statsbuf,iVar7,(off_t *)0x0,(size_t)w[1].done,0);
        if (sVar20 == -1) {
          uVar9 = *puVar12;
          if (uVar9 == 0xd) {
            iVar6 = fstatfs64(iVar11,(statfs64 *)&pfd);
            if ((iVar6 != -1) && (CONCAT26(pfd.revents,CONCAT24(pfd.events,pfd.fd)) == 0xc36400)) {
              if (uv__kernel_version_cached_version == 0) {
                iVar6 = uname((utsname *)&u);
                if ((iVar6 == -1) ||
                   (iVar6 = sscanf(u.release,"%u.%u.%u",&major,&minor), iVar6 != 3))
                goto LAB_0017b5c8;
                uv__kernel_version_cached_version = minor * 0x100 + major * 0x10000 + local_21f8;
              }
              if (uv__kernel_version_cached_version < 0x41400) goto LAB_0017b5c8;
            }
            uVar9 = *puVar12;
          }
          else if (uVar9 == 0x26) {
LAB_0017b5c8:
            *puVar12 = 0;
            uv__fs_sendfile_no_copy_file_range_support = '\x01';
            goto LAB_0017aa63;
          }
          if ((uVar9 == 0x5f) || (uVar9 == 0x12)) {
            *puVar12 = 0;
            goto LAB_0017aa63;
          }
          goto LAB_0017aa83;
        }
      }
      else {
LAB_0017aa63:
        sVar13 = sendfile64(iVar7,iVar11,(__off64_t *)&dst_statsbuf,(size_t)w[1].done);
        if (sVar13 == -1) {
LAB_0017aa83:
          if ((long)dst_statsbuf.st_dev <= (long)w[-1].done) {
            uVar9 = *puVar12;
            if (((uVar9 < 0x17) && ((0x440020U >> (uVar9 & 0x1f) & 1) != 0)) || (uVar9 == 0x58)) {
              bVar4 = true;
              *puVar12 = 0;
              local_21f0 = w[1].done;
              iVar7 = *(int *)w[-2].wq;
              iVar11 = *(int *)((long)w[-2].wq + 4);
              local_2210 = w[-1].done;
              p_Var26 = (_func_void_uv__work_ptr_int *)0x0;
LAB_0017aae2:
              for (; uVar14 = (long)local_21f0 - (long)p_Var26, p_Var26 <= local_21f0 && uVar14 != 0
                  ; p_Var26 = p_Var26 + lVar27) {
                sVar19 = 0x2000;
                if (uVar14 < 0x2000) {
                  sVar19 = uVar14;
                }
                while( true ) {
                  if (bVar4) {
                    lVar27 = pread64(iVar11,&u,sVar19,(__off64_t)local_2210);
                  }
                  else {
                    lVar27 = read(iVar11,&u,sVar19);
                  }
                  if (lVar27 != -1) break;
                  uVar9 = *puVar12;
                  if (uVar9 != 4) goto code_r0x0017ab3b;
                }
                if (lVar27 == 0) break;
                lVar23 = 0;
                while (lVar27 - lVar23 != 0 && lVar23 <= lVar27) {
                  local_21d8 = u.sysname + lVar23;
                  local_21e0 = lVar23;
                  while (sVar13 = write(iVar7,local_21d8,lVar27 - lVar23), sVar13 == -1) {
                    if (*puVar12 != 4) {
                      if (*puVar12 != 0xb) goto LAB_0017b59e;
                      pfd.events = 4;
                      pfd.revents = 0;
                      pfd.fd = iVar7;
                      while (iVar6 = poll((pollfd *)&pfd,1,-1), iVar6 == -1) {
                        if (*puVar12 != 4) goto LAB_0017b7c5;
                      }
                      if ((pfd.revents & 0xfffbU) != 0) {
LAB_0017b7c5:
                        *puVar12 = 5;
                        goto LAB_0017b59e;
                      }
                    }
                  }
                  lVar23 = local_21e0 + sVar13;
                }
                local_2210 = local_2210 + lVar27;
              }
              if (p_Var26 != (_func_void_uv__work_ptr_int *)0xffffffffffffffff) goto LAB_0017b7b7;
              goto LAB_0017b9c6;
            }
            goto LAB_0017b59e;
          }
        }
      }
      p_Var26 = (_func_void_uv__work_ptr_int *)(dst_statsbuf.st_dev - (long)w[-1].done);
      w[-1].done = (_func_void_uv__work_ptr_int *)dst_statsbuf.st_dev;
      goto LAB_0017b2e5;
    case 6:
      p_Var26 = w[-6].done;
      iVar7 = uv__fs_statx(-1,(char *)p_Var26,0,0,(uv_stat_t *)buf);
      if (iVar7 == -0x26) {
        iVar7 = stat64((char *)p_Var26,(stat64 *)&u);
LAB_0017b116:
        if (iVar7 == 0) {
          uv__to_stat((stat *)&u,(uv_stat_t *)buf);
          iVar7 = 0;
        }
      }
      break;
    case 7:
      p_Var26 = w[-6].done;
      iVar7 = uv__fs_statx(-1,(char *)p_Var26,0,1,(uv_stat_t *)buf);
      if (iVar7 == -0x26) {
        iVar7 = lstat64((char *)p_Var26,(stat64 *)&u);
        goto LAB_0017b116;
      }
      break;
    case 8:
      iVar11 = *(int *)w[-2].wq;
      iVar7 = uv__fs_statx(iVar11,"",1,0,(uv_stat_t *)buf);
      if ((iVar7 == -0x26) && (iVar7 = fstat64(iVar11,(stat64 *)&u), iVar7 == 0)) {
        uv__to_stat((stat *)&u,(uv_stat_t *)buf);
        iVar7 = 0;
      }
      break;
    case 9:
      iVar7 = ftruncate64(*(int *)w[-2].wq,(__off64_t)w[-1].done);
      break;
    case 10:
      u.sysname._0_16_ = uv__fs_to_timespec((double)w[-1].wq[0]);
      u.sysname._16_16_ = uv__fs_to_timespec((double)w[-1].wq[1]);
      p_Var26 = w[-6].done;
      iVar7 = 0;
      goto LAB_0017ac76;
    case 0xb:
      u.sysname._0_16_ = uv__fs_to_timespec((double)w[-1].wq[0]);
      u.sysname._16_16_ = uv__fs_to_timespec((double)w[-1].wq[1]);
      iVar7 = futimens(*(int *)w[-2].wq,(timespec *)&u);
      break;
    case 0xc:
      iVar7 = access((char *)w[-6].done,*(int *)((long)w[-2].wq + 4));
      break;
    case 0xd:
      iVar7 = chmod((char *)w[-6].done,*(__mode_t *)(w[-2].wq + 1));
      break;
    case 0xe:
      iVar7 = fchmod(*(int *)w[-2].wq,*(__mode_t *)(w[-2].wq + 1));
      break;
    case 0xf:
      iVar7 = fsync(*(int *)w[-2].wq);
      break;
    case 0x10:
      iVar7 = fdatasync(*(int *)w[-2].wq);
      break;
    case 0x11:
      iVar7 = unlink((char *)w[-6].done);
      break;
    case 0x12:
      iVar7 = rmdir((char *)w[-6].done);
      break;
    case 0x13:
      iVar7 = mkdir((char *)w[-6].done,*(__mode_t *)(w[-2].wq + 1));
      break;
    case 0x14:
      pcVar16 = mkdtemp((char *)w[-6].done);
      p_Var26 = (_func_void_uv__work_ptr_int *)-(ulong)(pcVar16 == (char *)0x0);
      goto LAB_0017b2e5;
    case 0x15:
      iVar7 = rename((char *)w[-6].done,(char *)w[-2].loop);
      break;
    case 0x16:
      auVar5._8_8_ = 0;
      auVar5[0] = u.sysname[8];
      auVar5[1] = u.sysname[9];
      auVar5[2] = u.sysname[10];
      auVar5[3] = u.sysname[0xb];
      auVar5[4] = u.sysname[0xc];
      auVar5[5] = u.sysname[0xd];
      auVar5[6] = u.sysname[0xe];
      auVar5[7] = u.sysname[0xf];
      u.sysname._0_16_ = auVar5 << 0x40;
      iVar7 = scandir64((char *)w[-6].done,(dirent64 ***)&u,uv__fs_scandir_filter,
                        uv__fs_scandir_sort);
      *(undefined4 *)((long)w[-2].wq + 0xc) = 0;
      if (iVar7 != -1) {
        p_Var17 = (_func_void_uv__work_ptr *)u.sysname._0_8_;
        if (iVar7 == 0) {
          free((void *)u.sysname._0_8_);
          p_Var17 = (_func_void_uv__work_ptr *)0x0;
        }
        w[-6].work = p_Var17;
        goto LAB_0017b3e3;
      }
LAB_0017b59e:
      p_Var26 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff;
      goto LAB_0017b2e5;
    case 0x17:
      iVar7 = link((char *)w[-6].done,(char *)w[-2].loop);
      break;
    case 0x18:
      iVar7 = symlink((char *)w[-6].done,(char *)w[-2].loop);
      break;
    case 0x19:
      sVar15 = pathconf((char *)w[-6].done,4);
      sVar28 = 0x1000;
      if (sVar15 != 0xffffffffffffffff) {
        sVar28 = sVar15;
      }
      p_Var17 = (_func_void_uv__work_ptr *)uv__malloc(sVar28);
      if (p_Var17 == (_func_void_uv__work_ptr *)0x0) {
        *puVar12 = 0xc;
      }
      else {
        sVar15 = readlink((char *)w[-6].done,(char *)p_Var17,sVar28);
        if (sVar15 == 0xffffffffffffffff) {
          uv__free(p_Var17);
        }
        else if ((sVar15 != sVar28) ||
                (p_Var17 = (_func_void_uv__work_ptr *)uv__reallocf(p_Var17,sVar28 + 1),
                sVar15 = sVar28, p_Var17 != (_func_void_uv__work_ptr *)0x0)) {
          p_Var17[sVar15] = (_func_void_uv__work_ptr)0x0;
          goto LAB_0017ba50;
        }
      }
      goto LAB_0017b2ef;
    case 0x1a:
      iVar7 = chown((char *)w[-6].done,*(__uid_t *)&w[-1].loop,*(__gid_t *)((long)&w[-1].loop + 4));
      break;
    case 0x1b:
      iVar7 = fchown(*(int *)w[-2].wq,*(__uid_t *)&w[-1].loop,*(__gid_t *)((long)&w[-1].loop + 4));
      break;
    case 0x1c:
      p_Var17 = (_func_void_uv__work_ptr *)realpath((char *)w[-6].done,(char *)0x0);
      if (p_Var17 != (_func_void_uv__work_ptr *)0x0) goto LAB_0017ba50;
      goto LAB_0017b2ef;
    case 0x1d:
      uVar9 = uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)&u,(char *)w[-6].done,0,0,(uv_fs_cb)0x0);
      uv_fs_req_cleanup((uv_fs_t *)&u);
      if (-1 < (int)uVar9) {
        iVar7 = fstat64(uVar9,(stat64 *)&pfd);
        if (iVar7 == 0) {
          uVar10 = uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)&u,(char *)w[-2].loop,
                              (*(uint *)((long)w[-2].wq + 4) & 1) << 7 | 0x41,local_21b8,
                              (uv_fs_cb)0x0);
          uv_fs_req_cleanup((uv_fs_t *)&u);
          uVar22 = uVar10;
          if (-1 < (int)uVar10) {
            if (((ulong)w[-2].wq[0] & 0x100000000) == 0) {
              iVar7 = fstat64(uVar10,(stat64 *)&dst_statsbuf);
              if (iVar7 == 0) {
                if ((CONCAT26(pfd.revents,CONCAT24(pfd.events,pfd.fd)) == dst_statsbuf.st_dev) &&
                   (uVar22 = 0, local_21c8 == dst_statsbuf.st_ino)) goto LAB_0017b538;
                iVar7 = ftruncate64(uVar10,0);
                if (iVar7 == 0) goto LAB_0017b849;
              }
LAB_0017b51c:
              uVar14 = (ulong)-*puVar12;
            }
            else {
LAB_0017b849:
              iVar7 = fchmod(uVar10,local_21b8);
              if (iVar7 != -1) {
LAB_0017b863:
                if (((ulong)w[-2].wq[0] & 0x600000000) != 0) {
                  iVar7 = ioctl(uVar10,0x40049409,(ulong)uVar9);
                  uVar22 = 0;
                  if (iVar7 == 0) goto LAB_0017b538;
                  if (((ulong)w[-2].wq[0] & 0x400000000) != 0) goto LAB_0017b51c;
                }
                lVar27 = 0;
                for (sVar28 = local_21a0; uVar22 = 0, sVar28 != 0; sVar28 = sVar28 - uVar14) {
                  uv_fs_sendfile((uv_loop_t *)0x0,(uv_fs_t *)&u,uVar10,uVar9,lVar27,sVar28,
                                 (uv_fs_cb)0x0);
                  uVar14 = u.nodename._23_8_;
                  uv_fs_req_cleanup((uv_fs_t *)&u);
                  if ((long)uVar14 < 0) goto LAB_0017b524;
                  lVar27 = lVar27 + uVar14;
                }
                goto LAB_0017b538;
              }
              if (*puVar12 == 1) {
                iVar7 = fstatfs64(uVar10,(statfs64 *)&major);
                uVar22 = 0xffffffff;
                if ((iVar7 == -1) || (major != 0xff534d42)) goto LAB_0017b538;
                goto LAB_0017b863;
              }
              uVar14 = (ulong)-*puVar12;
            }
LAB_0017b524:
            uVar22 = (uint)uVar14;
            goto LAB_0017b529;
          }
        }
        else {
          uVar22 = -*puVar12;
          uVar10 = 0xffffffff;
LAB_0017b529:
          uVar22 = (int)uVar22 >> 0x1f & uVar22;
        }
LAB_0017b538:
        uVar9 = uv__close_nocheckstdio(uVar9);
        if (uVar9 == 0) {
          uVar9 = uVar22;
        }
        if (uVar22 != 0) {
          uVar9 = uVar22;
        }
        if ((int)uVar10 < 0) {
          if (uVar9 == 0) goto LAB_0017b5a7;
        }
        else {
          uVar10 = uv__close_nocheckstdio(uVar10);
          if (uVar10 == 0) {
            uVar10 = uVar9;
          }
          if (uVar9 == 0) {
            uVar9 = uVar10;
          }
          if (uVar9 == 0) {
LAB_0017b5a7:
            p_Var26 = (_func_void_uv__work_ptr_int *)0x0;
            goto LAB_0017b2e5;
          }
          uv_fs_unlink((uv_loop_t *)0x0,(uv_fs_t *)&u,(char *)w[-2].loop,(uv_fs_cb)0x0);
          uv_fs_req_cleanup((uv_fs_t *)&u);
        }
        *puVar12 = -uVar9;
        goto LAB_0017b59e;
      }
      p_Var26 = (_func_void_uv__work_ptr_int *)(long)(int)uVar9;
      goto LAB_0017b2e5;
    case 0x1e:
      iVar7 = lchown((char *)w[-6].done,*(__uid_t *)&w[-1].loop,*(__gid_t *)((long)&w[-1].loop + 4))
      ;
      break;
    case 0x1f:
      p_Var17 = (_func_void_uv__work_ptr *)uv__malloc(0x38);
      if (p_Var17 == (_func_void_uv__work_ptr *)0x0) {
LAB_0017b30d:
        uv__free(p_Var17);
        p_Var26 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff;
        p_Var17 = (_func_void_uv__work_ptr *)0x0;
      }
      else {
        pDVar18 = opendir((char *)w[-6].done);
        *(DIR **)(p_Var17 + 0x30) = pDVar18;
        if (pDVar18 == (DIR *)0x0) goto LAB_0017b30d;
        p_Var26 = (_func_void_uv__work_ptr_int *)0x0;
      }
      w[-6].work = p_Var17;
      goto LAB_0017b2e5;
    case 0x20:
      p_Var17 = w[-6].work;
      local_221c = 0;
      while( true ) {
        uVar14 = (ulong)local_221c;
        do {
          if (*(ulong *)(p_Var17 + 8) <= uVar14) goto LAB_0017b3f2;
          *puVar12 = 0;
          dent = readdir64(*(DIR **)(p_Var17 + 0x30));
          if (dent == (dirent64 *)0x0) {
            if (*puVar12 != 0) goto LAB_0017b370;
            goto LAB_0017b3f2;
          }
        } while ((dent->d_name[0] == '.') &&
                ((dent->d_name[1] == '\0' || ((dent->d_name[1] == '.' && (dent->d_name[2] == '\0')))
                 )));
        lVar27 = *(long *)p_Var17;
        pcVar16 = uv__strdup(dent->d_name);
        *(char **)(lVar27 + uVar14 * 0x10) = pcVar16;
        if (pcVar16 == (char *)0x0) break;
        uVar8 = uv__fs_get_dirent_type((uv__dirent_t *)dent);
        *(uv_dirent_type_t *)(lVar27 + uVar14 * 0x10 + 8) = uVar8;
        local_221c = local_221c + 1;
      }
LAB_0017b370:
      for (lVar27 = 0; uVar14 << 4 != lVar27; lVar27 = lVar27 + 0x10) {
        uv__free(*(void **)(*(long *)p_Var17 + lVar27));
        *(undefined8 *)(*(long *)p_Var17 + lVar27) = 0;
      }
      local_221c = 0xffffffff;
LAB_0017b3f2:
      p_Var26 = (_func_void_uv__work_ptr_int *)(long)(int)local_221c;
      goto LAB_0017b2e5;
    case 0x21:
      p_Var17 = w[-6].work;
      if (*(DIR **)(p_Var17 + 0x30) != (DIR *)0x0) {
        closedir(*(DIR **)(p_Var17 + 0x30));
        *(undefined8 *)(p_Var17 + 0x30) = 0;
        p_Var17 = w[-6].work;
      }
      uv__free(p_Var17);
      p_Var17 = (_func_void_uv__work_ptr *)0x0;
LAB_0017ba50:
      w[-6].work = p_Var17;
      w[-7].wq[1] = (void *)0x0;
      goto LAB_0017b9e9;
    case 0x22:
      iVar7 = statfs64((char *)w[-6].done,(statfs64 *)&u);
      p_Var26 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff;
      if (iVar7 == 0) {
        p_Var17 = (_func_void_uv__work_ptr *)uv__malloc(0x58);
        if (p_Var17 == (_func_void_uv__work_ptr *)0x0) {
          *puVar12 = 0xc;
        }
        else {
          *(undefined8 *)p_Var17 = u.sysname._0_8_;
          *(undefined8 *)(p_Var17 + 8) = u.sysname._8_8_;
          *(undefined8 *)(p_Var17 + 0x10) = u.sysname._16_8_;
          *(undefined8 *)(p_Var17 + 0x18) = u.sysname._24_8_;
          *(undefined8 *)(p_Var17 + 0x20) = u.sysname._32_8_;
          *(undefined8 *)(p_Var17 + 0x28) = u.sysname._40_8_;
          *(undefined8 *)(p_Var17 + 0x30) = u.sysname._48_8_;
          w[-6].work = p_Var17;
          p_Var26 = (_func_void_uv__work_ptr_int *)0x0;
        }
      }
      goto LAB_0017b2e5;
    case 0x23:
      p_Var26 = w[-6].done;
      sVar19 = strlen((char *)p_Var26);
      if ((sVar19 < 6) || (iVar7 = strcmp((char *)(p_Var26 + (sVar19 - 6)),"XXXXXX"), iVar7 != 0)) {
        *puVar12 = 0x16;
        iVar7 = -1;
      }
      else {
        uv_once(&uv__fs_mkstemp_once,uv__mkostemp_initonce);
        if (uv__mkostemp != (_func_int_char_ptr_int *)0x0 &&
            (uv__fs_mkstemp_no_cloexec_support & 1) == 0) {
          iVar7 = (*uv__mkostemp)((char *)p_Var26,0x80000);
          if (-1 < iVar7) goto LAB_0017b3e3;
          if (*puVar12 != 0x16) goto LAB_0017b2ca;
          uv__fs_mkstemp_no_cloexec_support = 1;
        }
        if (w[-7].wq[0] != (void *)0x0) {
          uv_rwlock_rdlock(&(w[-7].loop)->cloexec_lock);
        }
        iVar7 = mkstemp64((char *)p_Var26);
        if ((-1 < iVar7) && (iVar11 = uv__cloexec_ioctl(iVar7,1), iVar11 != 0)) {
          iVar7 = uv__close(iVar7);
          if (iVar7 != 0) {
switchD_0017a993_default:
            abort();
          }
          iVar7 = -1;
        }
        if (w[-7].wq[0] != (void *)0x0) {
          uv_rwlock_rdunlock(&(w[-7].loop)->cloexec_lock);
        }
        if (-1 < iVar7) goto LAB_0017b3e3;
      }
LAB_0017b2ca:
      *p_Var26 = (_func_void_uv__work_ptr_int)0x0;
LAB_0017b3e3:
      p_Var26 = (_func_void_uv__work_ptr_int *)(long)iVar7;
      goto LAB_0017b2e5;
    case 0x24:
      u.sysname._0_16_ = uv__fs_to_timespec((double)w[-1].wq[0]);
      u.sysname._16_16_ = uv__fs_to_timespec((double)w[-1].wq[1]);
      p_Var26 = w[-6].done;
      iVar7 = 0x100;
LAB_0017ac76:
      iVar7 = utimensat(-100,(char *)p_Var26,(timespec *)&u,iVar7);
      break;
    default:
      goto switchD_0017a993_default;
    }
    p_Var26 = (_func_void_uv__work_ptr_int *)(long)iVar7;
LAB_0017b2e5:
    if (p_Var26 != (_func_void_uv__work_ptr_int *)0xffffffffffffffff) {
      w[-7].wq[1] = p_Var26;
      if (p_Var26 != (_func_void_uv__work_ptr_int *)0x0) {
        return;
      }
LAB_0017b9e9:
      if (2 < *(int *)&w[-7].done - 6U) {
        return;
      }
      w[-6].work = (_func_void_uv__work_ptr *)buf;
      return;
    }
LAB_0017b2ef:
    if ((0xfffffffd < iVar1 - 4U) || (*puVar12 != 4)) {
      w[-7].wq[1] = (void *)-(long)(int)*puVar12;
      return;
    }
  } while( true );
code_r0x0017ab3b:
  if ((p_Var26 != (_func_void_uv__work_ptr_int *)0x0) || (!bVar4)) {
    if (p_Var26 + 1 < (code *)0x2) {
LAB_0017b9c6:
      p_StackY_2230 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff;
      p_Var26 = p_StackY_2230;
    }
    else {
LAB_0017b7b7:
      w[-1].done = local_2210;
    }
    goto LAB_0017b2e5;
  }
  p_Var26 = (_func_void_uv__work_ptr_int *)0x0;
  bVar4 = false;
  if ((uVar9 == 5) || (uVar9 == 0x1d)) goto LAB_0017aae2;
  goto LAB_0017b59e;
LAB_0017ae1a:
  if (p_StackY_2230 == (_func_void_uv__work_ptr_int *)0x0) {
    p_StackY_2230 = (_func_void_uv__work_ptr_int *)0x0;
LAB_0017b7e0:
    if (p_Var26 == (_func_void_uv__work_ptr_int *)0x0) {
      p_Var26 = p_StackY_2230;
    }
    goto LAB_0017b7e7;
  }
  if (-1 < (long)w[-1].done) {
    w[-1].done = w[-1].done + (long)p_StackY_2230;
  }
  p_Var17 = w[-1].work;
  pcVar24 = p_Var17 + 8;
  uVar22 = 0;
  for (p_Var25 = p_StackY_2230; p_Var25 != (_func_void_uv__work_ptr_int *)0x0;
      p_Var25 = p_Var25 + -(long)p_Var3) {
    p_Var3 = *(_func_void_uv__work_ptr_int **)pcVar24;
    if (p_Var25 <= p_Var3 && (long)p_Var3 - (long)p_Var25 != 0) {
      *(_func_void_uv__work_ptr_int **)(pcVar24 + -8) = p_Var25 + *(ulong *)(pcVar24 + -8);
      *(long *)pcVar24 = (long)p_Var3 - (long)p_Var25;
      p_Var17 = w[-1].work;
      break;
    }
    uVar22 = uVar22 + 1;
    pcVar24 = pcVar24 + 0x10;
  }
  *(uint *)((long)w[-2].wq + 0xc) = uVar22;
  w[-1].work = p_Var17 + (ulong)uVar22 * 0x10;
  uVar9 = uVar9 - uVar22;
  p_Var26 = p_Var26 + (long)p_StackY_2230;
  goto LAB_0017ad67;
}

Assistant:

static void uv__fs_work(struct uv__work* w) {
  int retry_on_eintr;
  uv_fs_t* req;
  ssize_t r;

  req = container_of(w, uv_fs_t, work_req);
  retry_on_eintr = !(req->fs_type == UV_FS_CLOSE ||
                     req->fs_type == UV_FS_READ);

  do {
    errno = 0;

#define X(type, action)                                                       \
  case UV_FS_ ## type:                                                        \
    r = action;                                                               \
    break;

    switch (req->fs_type) {
    X(ACCESS, access(req->path, req->flags));
    X(CHMOD, chmod(req->path, req->mode));
    X(CHOWN, chown(req->path, req->uid, req->gid));
    X(CLOSE, uv__fs_close(req->file));
    X(COPYFILE, uv__fs_copyfile(req));
    X(FCHMOD, fchmod(req->file, req->mode));
    X(FCHOWN, fchown(req->file, req->uid, req->gid));
    X(LCHOWN, lchown(req->path, req->uid, req->gid));
    X(FDATASYNC, uv__fs_fdatasync(req));
    X(FSTAT, uv__fs_fstat(req->file, &req->statbuf));
    X(FSYNC, uv__fs_fsync(req));
    X(FTRUNCATE, ftruncate(req->file, req->off));
    X(FUTIME, uv__fs_futime(req));
    X(LUTIME, uv__fs_lutime(req));
    X(LSTAT, uv__fs_lstat(req->path, &req->statbuf));
    X(LINK, link(req->path, req->new_path));
    X(MKDIR, mkdir(req->path, req->mode));
    X(MKDTEMP, uv__fs_mkdtemp(req));
    X(MKSTEMP, uv__fs_mkstemp(req));
    X(OPEN, uv__fs_open(req));
    X(READ, uv__fs_read(req));
    X(SCANDIR, uv__fs_scandir(req));
    X(OPENDIR, uv__fs_opendir(req));
    X(READDIR, uv__fs_readdir(req));
    X(CLOSEDIR, uv__fs_closedir(req));
    X(READLINK, uv__fs_readlink(req));
    X(REALPATH, uv__fs_realpath(req));
    X(RENAME, rename(req->path, req->new_path));
    X(RMDIR, rmdir(req->path));
    X(SENDFILE, uv__fs_sendfile(req));
    X(STAT, uv__fs_stat(req->path, &req->statbuf));
    X(STATFS, uv__fs_statfs(req));
    X(SYMLINK, symlink(req->path, req->new_path));
    X(UNLINK, unlink(req->path));
    X(UTIME, uv__fs_utime(req));
    X(WRITE, uv__fs_write_all(req));
    default: abort();
    }
#undef X
  } while (r == -1 && errno == EINTR && retry_on_eintr);

  if (r == -1)
    req->result = UV__ERR(errno);
  else
    req->result = r;

  if (r == 0 && (req->fs_type == UV_FS_STAT ||
                 req->fs_type == UV_FS_FSTAT ||
                 req->fs_type == UV_FS_LSTAT)) {
    req->ptr = &req->statbuf;
  }
}